

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall chrono::ChLoadCustom::ChLoadCustom(ChLoadCustom *this,ChLoadCustom *param_1)

{
  ChLoadBase::ChLoadBase(&this->super_ChLoadBase,&param_1->super_ChLoadBase);
  (this->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoadCustom_0116c9a8;
  std::__shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
            );
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->load_Q,
             (DenseStorage<double,__1,__1,_1,_0> *)&param_1->load_Q);
  return;
}

Assistant:

class ChApi ChLoadCustom : public ChLoadBase {
  public:
    std::shared_ptr<ChLoadable> loadable;
    ChVectorDynamic<> load_Q;

    ChLoadCustom(std::shared_ptr<ChLoadable> mloadable);

    virtual ~ChLoadCustom() {}

    virtual int LoadGet_ndof_x() override;
    virtual int LoadGet_ndof_w() override;
    virtual void LoadGetStateBlock_x(ChState& mD) override;
    virtual void LoadGetStateBlock_w(ChStateDelta& mD) override;
    virtual void LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) override;
    virtual int LoadGet_field_ncoords() override;

    /// Compute jacobians (default fallback).
    /// Uses a numerical differentiation for computing K, R, M jacobians, if stiff load.
    /// If possible, override this with an analytical jacobian.
    /// Compute the K=-dQ/dx, R=-dQ/dv , M=-dQ/da jacobians.
    /// Note the sign that is flipped because assuming Q a right hand side, and dQ/d... at left hand side!
    /// Called automatically at each Update().
    virtual void ComputeJacobian(ChState* state_x,       ///< state position to evaluate jacobians
                                 ChStateDelta* state_w,  ///< state speed to evaluate jacobians
                                 ChMatrixRef mK,         ///< result -dQ/dx
                                 ChMatrixRef mR,         ///< result -dQ/dv
                                 ChMatrixRef mM          ///< result -dQ/da
                                 ) override;

    virtual void LoadIntLoadResidual_F(ChVectorDynamic<>& R, double c) override;

    /// Default fallback: compute jacobians via ComputeJacobian(), then use  M=-dQ/da  to do R += c*M*w.
    /// If possible, override this to bypass jacobian computation, if analytical expression c*M*w is known.
    /// Not needed (ex. override to {} ) if no M is involved, ex. no inertial effects.
    virtual void LoadIntLoadResidual_Mv(ChVectorDynamic<>& R,        ///< result: the R residual, R += c*M*w
                                        const ChVectorDynamic<>& w,  ///< the w vector
                                        double c                     ///< scaling factor
                                        ) override;

    /// Create the jacobian loads if needed, and also
    /// set the ChVariables referenced by the sparse KRM block.
    virtual void CreateJacobianMatrices() override;

    /// Access the generalized load vector Q.
    virtual ChVectorDynamic<>& GetQ() { return load_Q; }
}